

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::refill(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  CAddr CVar2;
  pointer pbVar3;
  bool bVar4;
  Cell CVar5;
  uint uVar6;
  ulong uVar7;
  uint x;
  Cell i;
  int iVar8;
  
  requireDStackAvailable(this,1,"REFILL");
  CVar1 = this->sourceid;
  CVar5 = dataSpaceAtCell(this,this->VarOffsetBlkAddress);
  if (CVar5 == 0) {
    if (((int)CVar1 < 0) ||
       (pbVar3 = (this->inputBufferStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       uVar7 = this->inputBufferStringsCurrent + 1, this->inputBufferStringsCurrent = uVar7,
       (ulong)((long)pbVar3 -
               (long)(this->inputBufferStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7)) {
      uVar6 = this->False;
    }
    else {
      bVar4 = setSourceBuffer(this);
      if (bVar4) {
        uVar6 = this->True;
      }
      else {
        uVar6 = this->False;
      }
    }
  }
  else {
    x = CVar5 + 1;
    this_00 = &this->dStack;
    ForthStack<unsigned_int>::push(this_00,x);
    block(this);
    uVar6 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    this->sourceid = 0;
    CVar2 = this->VarOffsetBlkAddress;
    iVar8 = 0;
    do {
      dataSpaceSet(this,CVar2 + iVar8,(Char)x);
      x = x >> 8;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    setSourceVariables(this,uVar6,0x400,0);
    uVar6 = this->True;
  }
  ForthStack<unsigned_int>::push(&this->dStack,uVar6);
  return;
}

Assistant:

void refill() { 
			REQUIRE_DSTACK_AVAILABLE(1, "REFILL");
			auto sourceid_ = getSourceId();
			auto blk=getDataCell(VarOffsetBlkAddress);
			if (blk > 0) {
				++blk;
				dStack.push(blk);
				block();
				auto address=dStack.getTop();pop();
				setSourceId(0);
				setDataCell(VarOffsetBlkAddress, Cell(blk)); // set BLK=u
				setSourceVariables(address, 1024, 0);
				push(True);
			}
			else {
				if (sourceid_ >= 0) { // if input from file or from input buffer
					inputBufferStringsCurrent++;
					if (inputBufferStringsCurrent < inputBufferStrings.size()) {
						if (setSourceBuffer()) {
							push(True);
						}
						else {
							push(False);
						}
					}
					else {
						push(False);
					}
				}
				else {
					push(False); // input from EVALUATE
				}
			}
		}